

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwSetWindowSizeLimits
               (GLFWwindow *handle,int minwidth,int minheight,int maxwidth,int maxheight)

{
  ulong uVar1;
  ulong uVar2;
  char *format;
  _GLFWwindow *window;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/window.c"
                  ,0x23a,"void glfwSetWindowSizeLimits(GLFWwindow *, int, int, int, int)");
  }
  uVar1 = (ulong)(uint)minheight;
  uVar2 = (ulong)(uint)minwidth;
  if (_glfw.initialized != 0) {
    if ((minheight | minwidth) < 0 && (minheight != -1 && minwidth != -1)) {
      format = "Invalid window minimum size %ix%i";
    }
    else {
      if ((maxheight == -1 || maxwidth == -1) ||
         (((minheight <= maxheight && (minwidth <= maxwidth)) && (-1 < (maxheight | maxwidth))))) {
        *(int *)(handle + 0x50) = minwidth;
        *(int *)(handle + 0x54) = minheight;
        *(int *)(handle + 0x58) = maxwidth;
        *(int *)(handle + 0x5c) = maxheight;
        if ((*(long *)(handle + 0x40) == 0) && (*(int *)(handle + 8) != 0)) {
          _glfwPlatformSetWindowSizeLimits
                    ((_GLFWwindow *)handle,minwidth,minheight,maxwidth,maxheight);
          return;
        }
        return;
      }
      format = "Invalid window maximum size %ix%i";
      uVar2 = (ulong)(uint)maxwidth;
      uVar1 = (ulong)(uint)maxheight;
    }
    _glfwInputError(0x10004,format,uVar2,uVar1);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowSizeLimits(GLFWwindow* handle,
                                     int minwidth, int minheight,
                                     int maxwidth, int maxheight)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (minwidth != GLFW_DONT_CARE && minheight != GLFW_DONT_CARE)
    {
        if (minwidth < 0 || minheight < 0)
        {
            _glfwInputError(GLFW_INVALID_VALUE,
                            "Invalid window minimum size %ix%i",
                            minwidth, minheight);
            return;
        }
    }

    if (maxwidth != GLFW_DONT_CARE && maxheight != GLFW_DONT_CARE)
    {
        if (maxwidth < 0 || maxheight < 0 ||
            maxwidth < minwidth || maxheight < minheight)
        {
            _glfwInputError(GLFW_INVALID_VALUE,
                            "Invalid window maximum size %ix%i",
                            maxwidth, maxheight);
            return;
        }
    }

    window->minwidth  = minwidth;
    window->minheight = minheight;
    window->maxwidth  = maxwidth;
    window->maxheight = maxheight;

    if (window->monitor || !window->resizable)
        return;

    _glfwPlatformSetWindowSizeLimits(window,
                                     minwidth, minheight,
                                     maxwidth, maxheight);
}